

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

LY_ERR parse_typedef(lysp_yang_ctx *ctx,lysp_node *parent,lysp_tpdf **typedefs)

{
  lysp_ext_instance **exts;
  lysp_tpdf *plVar1;
  LY_ERR LVar2;
  LY_ERR LVar3;
  long *plVar4;
  long lVar5;
  char *pcVar6;
  uint16_t *puVar7;
  char *format;
  ly_ctx *plVar8;
  void *parent_00;
  ly_stmt lVar9;
  uint16_t *puVar10;
  char **str_p;
  bool bVar11;
  undefined4 uStack_90;
  ly_stmt kw;
  char *word;
  size_t word_len;
  lysp_type *local_78;
  uint16_t *local_70;
  uint16_t *local_68;
  uint16_t *local_60;
  uint16_t *local_58;
  uint16_t *local_50;
  uint16_t *local_48;
  lysp_node *local_40;
  char *buf;
  
  plVar1 = *typedefs;
  if (plVar1 == (lysp_tpdf *)0x0) {
    plVar4 = (long *)malloc(0xb8);
    if (plVar4 == (long *)0x0) goto LAB_00170a2b;
    *plVar4 = 1;
    lVar5 = 1;
  }
  else {
    lVar5 = *(long *)&plVar1[-1].flags;
    *(long *)&plVar1[-1].flags = lVar5 + 1;
    plVar4 = (long *)realloc(&plVar1[-1].flags,lVar5 * 0xb0 + 0xb8);
    if (plVar4 == (long *)0x0) {
      *(long *)&(*typedefs)[-1].flags = *(long *)&(*typedefs)[-1].flags + -1;
LAB_00170a2b:
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar8 = (ly_ctx *)0x0;
      }
      else {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(plVar8,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_typedef");
      return LY_EMEM;
    }
    lVar5 = *plVar4;
  }
  *typedefs = (lysp_tpdf *)(plVar4 + 1);
  str_p = (char **)(plVar4 + lVar5 * 0x16 + -0x15);
  memset(str_p,0,0xb0);
  LVar2 = get_argument(ctx,Y_IDENTIF_ARG,(uint16_t *)0x0,&word,&buf,&word_len);
  if (LVar2 == LY_SUCCESS) {
    if (buf == (char *)0x0) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar8 = (ly_ctx *)0x0;
      }
      else {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      pcVar6 = word;
      if (word_len == 0) {
        pcVar6 = "";
      }
      LVar2 = lydict_insert(plVar8,pcVar6,word_len,str_p);
    }
    else {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar8 = (ly_ctx *)0x0;
      }
      else {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar2 = lydict_insert_zc(plVar8,word,str_p);
    }
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    LVar2 = get_keyword(ctx,&kw,&word,&word_len);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    local_40 = parent;
    if (kw == LY_STMT_SYNTAX_SEMICOLON) {
      bVar11 = false;
    }
    else {
      if (kw != LY_STMT_SYNTAX_LEFT_BRACE) {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar8 = (ly_ctx *)0x0;
        }
        else {
          plVar8 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar6 = lyplg_ext_stmt2str(kw);
        ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,
                "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar6);
        return LY_EVALID;
      }
      LVar2 = get_keyword(ctx,&kw,&word,&word_len);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      bVar11 = kw != LY_STMT_SYNTAX_RIGHT_BRACE;
    }
    puVar10 = (uint16_t *)(plVar4 + lVar5 * 0x16);
    exts = (lysp_ext_instance **)(puVar10 + -0x38);
    local_48 = puVar10 + -0x50;
    local_78 = (lysp_type *)(puVar10 + -0x34);
    local_58 = puVar10 + -0x3c;
    local_60 = puVar10 + -0x40;
    local_68 = puVar10 + -0x4c;
    local_70 = puVar10 + -0x44;
    lVar9 = kw;
    local_50 = puVar10;
    while (bVar11) {
      if (lVar9 == LY_STMT_UNITS) {
        parent_00 = *(void **)local_48;
        lVar9 = LY_STMT_UNITS;
        puVar7 = local_48;
LAB_00170cbc:
        LVar2 = parse_text_field(ctx,parent_00,lVar9,(uint32_t)puVar7,(char **)0x2,Y_IDENTIF_ARG,
                                 (uint16_t *)exts,(lysp_ext_instance **)CONCAT44(kw,uStack_90));
LAB_00170cc8:
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
      }
      else {
        if (lVar9 == LY_STMT_DESCRIPTION) {
          parent_00 = *(void **)local_60;
          lVar9 = LY_STMT_DESCRIPTION;
          puVar7 = local_60;
          goto LAB_00170cbc;
        }
        if (lVar9 == LY_STMT_EXTENSION_INSTANCE) {
          LVar2 = parse_ext(ctx,word,word_len,str_p,LY_STMT_TYPEDEF,0,exts);
          goto LAB_00170cc8;
        }
        if (lVar9 == LY_STMT_REFERENCE) {
          parent_00 = *(void **)local_58;
          lVar9 = LY_STMT_REFERENCE;
          puVar7 = local_58;
          goto LAB_00170cbc;
        }
        if (lVar9 == LY_STMT_STATUS) {
          LVar2 = parse_status(ctx,local_50,exts);
          goto LAB_00170cc8;
        }
        if (lVar9 == LY_STMT_TYPE) {
          LVar2 = parse_type(ctx,local_78);
          goto LAB_00170cc8;
        }
        if (lVar9 != LY_STMT_DEFAULT) {
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar8 = (ly_ctx *)0x0;
          }
          else {
            plVar8 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar6 = lyplg_ext_stmt2str(lVar9);
          format = "Invalid keyword \"%s\" as a child of \"%s\".";
          goto LAB_00170e44;
        }
        LVar2 = parse_text_field(ctx,local_68,LY_STMT_DEFAULT,(uint32_t)local_68,(char **)0x2,
                                 (yang_arg)local_70,(uint16_t *)exts,
                                 (lysp_ext_instance **)CONCAT44(kw,uStack_90));
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
        *(lyd_node **)(puVar10 + -0x48) =
             (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar2 = get_keyword(ctx,&kw,&word,&word_len);
      lVar9 = kw;
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      bVar11 = kw != LY_STMT_SYNTAX_RIGHT_BRACE;
      if (((!bVar11) && (*exts != (lysp_ext_instance *)0x0)) &&
         (LVar2 = ly_set_add(&ctx->main_ctx->ext_inst,*exts,'\x01',(uint32_t *)0x0),
         LVar2 != LY_SUCCESS)) {
        return LVar2;
      }
    }
    if (local_78->name == (char *)0x0) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar8 = (ly_ctx *)0x0;
      }
      else {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      format = "Missing mandatory keyword \"%s\" as a child of \"%s\".";
      pcVar6 = "type";
LAB_00170e44:
      ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar6,"typedef");
      return LY_EVALID;
    }
    if (local_40 == (lysp_node *)0x0) {
      LVar2 = LY_SUCCESS;
    }
    else {
      if (ctx->main_ctx == (lysp_ctx *)0x0) {
        __assert_fail("ctx->main_ctx",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yang.c"
                      ,0xb14,
                      "LY_ERR parse_typedef(struct lysp_yang_ctx *, struct lysp_node *, struct lysp_tpdf **)"
                     );
      }
      LVar3 = ly_set_add(&ctx->main_ctx->tpdfs_nodes,local_40,'\0',(uint32_t *)0x0);
      LVar2 = LVar3 + (LVar3 == LY_SUCCESS);
      if (LVar3 == LY_SUCCESS) {
        LVar2 = LY_SUCCESS;
      }
    }
  }
  return LVar2;
}

Assistant:

static LY_ERR
parse_typedef(struct lysp_yang_ctx *ctx, struct lysp_node *parent, struct lysp_tpdf **typedefs)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_tpdf *tpdf;

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *typedefs, tpdf, LY_EMEM);

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, tpdf->name, word, word_len, ret, cleanup);

    /* parse substatements */
    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_DEFAULT:
            LY_CHECK_RET(parse_text_field(ctx, &tpdf->dflt, LY_STMT_DEFAULT, 0, &tpdf->dflt.str, Y_STR_ARG,
                    &tpdf->dflt.flags, &tpdf->exts));
            tpdf->dflt.mod = PARSER_CUR_PMOD(ctx);
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, tpdf->dsc, LY_STMT_DESCRIPTION, 0, &tpdf->dsc, Y_STR_ARG, NULL, &tpdf->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, tpdf->ref, LY_STMT_REFERENCE, 0, &tpdf->ref, Y_STR_ARG, NULL, &tpdf->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &tpdf->flags, &tpdf->exts));
            break;
        case LY_STMT_TYPE:
            LY_CHECK_RET(parse_type(ctx, &tpdf->type));
            break;
        case LY_STMT_UNITS:
            LY_CHECK_RET(parse_text_field(ctx, tpdf->units, LY_STMT_UNITS, 0, &tpdf->units, Y_STR_ARG, NULL, &tpdf->exts));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, tpdf, LY_STMT_TYPEDEF, 0, &tpdf->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "typedef");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, tpdf->exts, ret, cleanup);
    }

    /* mandatory substatements */
    if (!tpdf->type.name) {
        LOGVAL_PARSER(ctx, LY_VCODE_MISSTMT, "type", "typedef");
        return LY_EVALID;
    }

    /* store data for collision check */
    if (parent) {
        assert(ctx->main_ctx);
        LY_CHECK_RET(ly_set_add(&ctx->main_ctx->tpdfs_nodes, parent, 0, NULL));
    }

cleanup:
    return ret;
}